

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O3

void __thiscall five_point_solver::advance_e(five_point_solver *this)

{
  long *plVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar38;
  uint uVar39;
  field3d<celle> *pfVar40;
  field3d<cellj> *pfVar41;
  cellj *pcVar42;
  celle *pcVar43;
  cellb **ppcVar44;
  cellb *pcVar45;
  cellb *pcVar46;
  cellb ***pppcVar47;
  field3d<cellb> *pfVar48;
  cellb **ppcVar49;
  cellb **ppcVar50;
  cellb **ppcVar51;
  celle **ppcVar52;
  cellj **ppcVar53;
  long lVar54;
  byte bVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  ulong uVar64;
  cellb *pcVar65;
  ulong uVar66;
  ulong uVar67;
  long lVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar112 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  
  pfVar40 = (this->super_maxwell_solver).ce;
  iVar37 = pfVar40->nx;
  iVar38 = pfVar40->ny;
  uVar39 = pfVar40->nz;
  uVar63 = iVar38 - 2;
  uVar61 = (ulong)(iVar37 - 2);
  if (4 < iVar37) {
    auVar72._8_8_ = 0x8000000000000000;
    auVar72._0_8_ = 0x8000000000000000;
    auVar80 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar81 = vpbroadcastq_avx512f(ZEXT816(0x18));
    in_ZMM20 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar67 = 2;
    auVar82 = vpbroadcastq_avx512f();
    auVar123 = vmovdqu64_avx512f(auVar82);
    do {
      if (4 < iVar38) {
        uVar66 = 2;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = (this->super_maxwell_solver).dtdx;
        auVar83 = vbroadcastsd_avx512f(auVar69);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = (this->super_maxwell_solver).dtdz;
        auVar84 = vbroadcastsd_avx512f(auVar73);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = (this->super_maxwell_solver).dtdy;
        auVar85 = vbroadcastsd_avx512f(auVar70);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = this->ay;
        auVar86 = vbroadcastsd_avx512f(auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = this->by;
        in_ZMM16 = vbroadcastsd_avx512f(auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = this->az;
        auVar87 = vbroadcastsd_avx512f(auVar10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->bz;
        auVar88 = vbroadcastsd_avx512f(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = (this->super_maxwell_solver).dx;
        auVar89 = vbroadcastsd_avx512f(auVar12);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = this->ax;
        auVar90 = vbroadcastsd_avx512f(auVar13);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = this->bx;
        in_ZMM17 = vbroadcastsd_avx512f(auVar14);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (this->super_maxwell_solver).dy;
        in_ZMM22 = vbroadcastsd_avx512f(auVar15);
        pfVar41 = (this->super_maxwell_solver).cj;
        auVar133._0_8_ = auVar83._0_8_ ^ 0x8000000000000000;
        auVar133._8_8_ = auVar83._8_8_ ^ 0x8000000000000000;
        auVar73 = auVar84._0_16_;
        auVar69 = vxorpd_avx512vl(auVar73,auVar72);
        auVar134._0_8_ = auVar85._0_8_ ^ 0x8000000000000000;
        auVar134._8_8_ = auVar85._8_8_ ^ 0x8000000000000000;
        auVar91 = vbroadcastsd_avx512f(auVar133);
        auVar92 = vbroadcastsd_avx512f(auVar69);
        in_ZMM18 = vbroadcastsd_avx512f(auVar134);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = (this->super_maxwell_solver).dz;
        auVar93 = vbroadcastsd_avx512f(auVar16);
        do {
          if (4 < (int)uVar39) {
            auVar94 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
            pcVar42 = (pfVar41->p)._M_t.
                      super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                      super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar67][uVar66];
            pcVar43 = (pfVar40->p)._M_t.
                      super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                      super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar67][uVar66];
            ppcVar44 = (((this->super_maxwell_solver).cb)->p)._M_t.
                       super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                       super__Head_base<0UL,_cellb_***,_false>._M_head_impl[uVar67];
            auVar95 = vpbroadcastq_avx512f();
            auVar95 = vmovdqu64_avx512f(auVar95);
            auVar96 = vpbroadcastq_avx512f();
            auVar96 = vmovdqu64_avx512f(auVar96);
            pcVar65 = ppcVar44[uVar66];
            pcVar45 = ppcVar44[uVar66 - 2];
            pcVar46 = ppcVar44[uVar66 - 1];
            auVar17._8_8_ = 0;
            auVar17._0_8_ = pcVar65->bx;
            auVar97 = vbroadcastsd_avx512f(auVar17);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = pcVar65[2].bx;
            auVar98 = vbroadcastsd_avx512f(auVar18);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = pcVar65->by;
            auVar99 = vbroadcastsd_avx512f(auVar19);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = pcVar65[2].by;
            auVar100 = vbroadcastsd_avx512f(auVar20);
            auVar101 = vpbroadcastq_avx512f();
            auVar101 = vmovdqu64_avx512f(auVar101);
            auVar102 = vpbroadcastq_avx512f();
            uVar62 = 0;
            auVar102 = vmovdqu64_avx512f(auVar102);
            auVar103 = vpbroadcastq_avx512f();
            auVar103 = vmovdqu64_avx512f(auVar103);
            do {
              auVar104 = vpbroadcastq_avx512f();
              auVar81 = vpmullq_avx512dq(auVar94,auVar81);
              auVar69 = vxorpd_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
              in_ZMM19 = vmovdqa64_avx512f(auVar80);
              uVar62 = uVar62 + 8;
              auVar94 = vpaddq_avx512f(auVar94,in_ZMM20);
              auVar80 = vporq_avx512f(auVar104,auVar80);
              uVar64 = vpcmpuq_avx512f(auVar80,auVar82,2);
              auVar70 = vxorpd_avx512vl(auVar73,auVar73);
              auVar80 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar41->nx + (long)pcVar43));
              bVar55 = (byte)uVar64;
              auVar82._0_8_ =
                   (ulong)(bVar55 & 1) * auVar80._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar82._8_8_ = (ulong)bVar56 * auVar80._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
              auVar82._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar82._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar82._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar82._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar82._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar82._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65->bz + (long)pfVar41));
              auVar104._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar80._8_8_;
              auVar104._0_8_ = (ulong)(bVar55 & 1) * auVar80._0_8_;
              auVar104._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar104._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar104._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar104._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar104._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar104._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pcVar46->bx +
                                            (long)&(pfVar41->p)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>));
              auVar106._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar80._8_8_;
              auVar106._0_8_ = (ulong)(bVar55 & 1) * auVar80._0_8_;
              auVar106._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar106._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar106._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar106._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar106._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar106._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&ppcVar44[uVar66 + 1]->bx +
                                            (long)&(pfVar41->p)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>));
              auVar105._0_8_ =
                   (ulong)(bVar55 & 1) * auVar80._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar70._0_8_;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar105._8_8_ = (ulong)bVar56 * auVar80._8_8_ | (ulong)!bVar56 * auVar70._8_8_;
              auVar105._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar105._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar105._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar105._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar105._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar105._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vsubpd_avx512f(auVar104,auVar106);
              auVar105 = vsubpd_avx512f(auVar105,auVar104);
              auVar106 = vaddpd_avx512f(auVar106,auVar105);
              auVar69 = vxorpd_avx512vl(auVar105._0_16_,auVar105._0_16_);
              auVar105 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pcVar45->bx +
                                             (long)&(pfVar41->p)._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                  .super__Head_base<0UL,_cellj_***,_false>));
              auVar107._0_8_ =
                   (ulong)(bVar55 & 1) * auVar105._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_
              ;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar107._8_8_ = (ulong)bVar56 * auVar105._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
              auVar107._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar105._16_8_;
              auVar107._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar105._24_8_;
              auVar107._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar105._32_8_;
              auVar107._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar105._40_8_;
              auVar107._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar105._48_8_;
              auVar107._56_8_ = (uVar64 >> 7) * auVar105._56_8_;
              auVar105 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65[-1].by + (long)pfVar41));
              auVar108._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar105._8_8_;
              auVar108._0_8_ = (ulong)(bVar55 & 1) * auVar105._0_8_;
              auVar108._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar105._16_8_;
              auVar108._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar105._24_8_;
              auVar108._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar105._32_8_;
              auVar108._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar105._40_8_;
              auVar108._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar105._48_8_;
              auVar108._56_8_ = (uVar64 >> 7) * auVar105._56_8_;
              auVar106 = vsubpd_avx512f(auVar106,auVar107);
              auVar99 = vpermt2pd_avx512f(_DAT_00138cc0,auVar99);
              auVar106 = vmulpd_avx512f(auVar86,auVar106);
              auVar105 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65[1].by + (long)pfVar41));
              auVar109._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar105._8_8_;
              auVar109._0_8_ = (ulong)(bVar55 & 1) * auVar105._0_8_;
              auVar109._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar105._16_8_;
              auVar109._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar105._24_8_;
              auVar109._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar105._32_8_;
              auVar109._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar105._40_8_;
              auVar109._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar105._48_8_;
              auVar109._56_8_ = (uVar64 >> 7) * auVar105._56_8_;
              auVar80 = vfmadd231pd_avx512f(auVar106,in_ZMM16,auVar80);
              auVar100 = vpermt2pd_avx512f(_DAT_00138cc0,auVar100);
              auVar80 = vfmadd213pd_avx512f(auVar80,auVar85,auVar82);
              auVar82 = vsubpd_avx512f(auVar109,auVar100);
              auVar106 = vsubpd_avx512f(auVar100,auVar108);
              auVar82 = vaddpd_avx512f(auVar108,auVar82);
              auVar82 = vsubpd_avx512f(auVar82,auVar99);
              auVar82 = vmulpd_avx512f(auVar87,auVar82);
              auVar99 = vpaddq_avx512f(auVar81,auVar95);
              auVar82 = vfmadd231pd_avx512f(auVar82,auVar88,auVar106);
              auVar106 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar41->nx + (long)pcVar42));
              auVar110._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar106._8_8_;
              auVar110._0_8_ = (ulong)(bVar55 & 1) * auVar106._0_8_;
              auVar110._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar106._16_8_;
              auVar110._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar106._24_8_;
              auVar110._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar106._32_8_;
              auVar110._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar106._40_8_;
              auVar110._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar106._48_8_;
              auVar110._56_8_ = (uVar64 >> 7) * auVar106._56_8_;
              auVar80 = vfmadd213pd_avx512f(auVar82,auVar92,auVar80);
              auVar82 = vfnmadd213pd_avx512f(auVar110,auVar89,auVar80);
              auVar69 = vxorpd_avx512vl(auVar80._0_16_,auVar80._0_16_);
              vscatterqpd_avx512f(ZEXT864(pcVar43) + ZEXT864(0) + auVar87,uVar64,auVar82);
              vpaddq_avx512f(auVar81,auVar101);
              vpaddq_avx512f(auVar81,auVar102);
              auVar80 = vgatherqpd_avx512f(pcVar42->jy);
              auVar111._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar80._8_8_;
              auVar111._0_8_ = (ulong)(bVar55 & 1) * auVar80._0_8_;
              auVar111._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar111._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar111._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar111._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar111._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar111._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vgatherqpd_avx512f(pcVar46->bz);
              auVar71._0_8_ =
                   (ulong)(bVar55 & 1) * auVar80._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar71._8_8_ = (ulong)bVar56 * auVar80._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
              auVar112._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar112._0_16_ = auVar71;
              auVar112._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar112._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar112._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar112._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar112._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar39 + 0x10));
              auVar113._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar80._8_8_;
              auVar113._0_8_ = (ulong)(bVar55 & 1) * auVar80._0_8_;
              auVar113._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar80._16_8_;
              auVar113._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar80._24_8_;
              auVar113._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar80._32_8_;
              auVar113._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar80._40_8_;
              auVar113._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar80._48_8_;
              auVar113._56_8_ = (uVar64 >> 7) * auVar80._56_8_;
              auVar80 = vsubpd_avx512f(auVar104,auVar112);
              auVar82 = vsubpd_avx512f(auVar113,auVar104);
              vpaddq_avx512f(auVar81,auVar103);
              auVar82 = vaddpd_avx512f(auVar112,auVar82);
              auVar69 = vxorpd_avx512vl(auVar71,auVar71);
              auVar104 = vgatherqpd_avx512f(*(undefined8 *)(uVar67 + 0x10));
              auVar114._0_8_ =
                   (ulong)(bVar55 & 1) * auVar104._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_
              ;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar114._8_8_ = (ulong)bVar56 * auVar104._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
              auVar114._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar104._16_8_;
              auVar114._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar104._24_8_;
              auVar114._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar104._32_8_;
              auVar114._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar104._40_8_;
              auVar114._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar104._48_8_;
              auVar114._56_8_ = (uVar64 >> 7) * auVar104._56_8_;
              auVar104 = vgatherqpd_avx512f(*(undefined8 *)
                                             ((long)&pfVar41->nx + (long)&pcVar65[-1].bx));
              auVar115._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar104._8_8_;
              auVar115._0_8_ = (ulong)(bVar55 & 1) * auVar104._0_8_;
              auVar115._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar104._16_8_;
              auVar115._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar104._24_8_;
              auVar115._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar104._32_8_;
              auVar115._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar104._40_8_;
              auVar115._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar104._48_8_;
              auVar115._56_8_ = (uVar64 >> 7) * auVar104._56_8_;
              auVar82 = vsubpd_avx512f(auVar82,auVar114);
              auVar82 = vmulpd_avx512f(auVar90,auVar82);
              auVar97 = vpermt2pd_avx512f(_DAT_00138cc0,auVar97);
              auVar82 = vfmadd231pd_avx512f(auVar82,in_ZMM17,auVar80);
              auVar69 = vxorpd_avx512vl(auVar80._0_16_,auVar80._0_16_);
              auVar80 = vfmadd132pd_avx512f(auVar82,auVar111,auVar91);
              auVar82 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pfVar41->nx + (long)&pcVar65[1].bx));
              in_ZMM31._0_8_ =
                   (ulong)(bVar55 & 1) * auVar82._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
              bVar56 = (bool)((byte)(uVar64 >> 1) & 1);
              in_ZMM31._8_8_ = (ulong)bVar56 * auVar82._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
              in_ZMM31._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar82._16_8_;
              in_ZMM31._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar82._24_8_;
              in_ZMM31._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar82._32_8_;
              in_ZMM31._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar82._40_8_;
              in_ZMM31._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar82._48_8_;
              in_ZMM31._56_8_ = (uVar64 >> 7) * auVar82._56_8_;
              auVar82 = vpermt2pd_avx512f(_DAT_00138cc0,auVar98);
              auVar98 = vsubpd_avx512f(in_ZMM31,auVar82);
              auVar98 = vaddpd_avx512f(auVar115,auVar98);
              auVar98 = vsubpd_avx512f(auVar98,auVar97);
              auVar97 = vsubpd_avx512f(auVar82,auVar115);
              auVar98 = vmulpd_avx512f(auVar87,auVar98);
              auVar98 = vfmadd231pd_avx512f(auVar98,auVar88,auVar97);
              vpaddq_avx512f(auVar81,auVar96);
              auVar80 = vfmadd213pd_avx512f(auVar98,auVar84,auVar80);
              auVar81 = vgatherqpd_avx512f(pcVar45->by);
              auVar98._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar81._8_8_;
              auVar98._0_8_ = (ulong)(bVar55 & 1) * auVar81._0_8_;
              auVar98._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar81._16_8_;
              auVar98._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar81._24_8_;
              auVar98._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar81._32_8_;
              auVar98._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar81._40_8_;
              auVar98._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar81._48_8_;
              auVar98._56_8_ = (uVar64 >> 7) * auVar81._56_8_;
              auVar80 = vfnmadd213pd_avx512f(auVar98,in_ZMM22,auVar80);
              vscatterqpd_avx512f(ZEXT864(8) + auVar99,uVar64,auVar80);
              auVar80 = vmovdqa64_avx512f(in_ZMM19);
              auVar81 = vgatherqpd_avx512f(pcVar46->by);
              auVar97._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar81._8_8_;
              auVar97._0_8_ = (ulong)(bVar55 & 1) * auVar81._0_8_;
              auVar97._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar81._16_8_;
              auVar97._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar81._24_8_;
              auVar97._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar81._32_8_;
              auVar97._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar81._40_8_;
              auVar97._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar81._48_8_;
              auVar97._56_8_ = (uVar64 >> 7) * auVar81._56_8_;
              auVar81 = vgatherqpd_avx512f(*(undefined8 *)((ulong)uVar39 + 8));
              auVar116._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar81._8_8_;
              auVar116._0_8_ = (ulong)(bVar55 & 1) * auVar81._0_8_;
              auVar116._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar81._16_8_;
              auVar116._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar81._24_8_;
              auVar116._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar81._32_8_;
              auVar116._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar81._40_8_;
              auVar116._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar81._48_8_;
              auVar116._56_8_ = (uVar64 >> 7) * auVar81._56_8_;
              auVar98 = vsubpd_avx512f(auVar100,auVar97);
              auVar100 = vsubpd_avx512f(auVar116,auVar100);
              auVar81 = vpbroadcastq_avx512f(ZEXT816(0x18));
              auVar100 = vaddpd_avx512f(auVar97,auVar100);
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)(uVar67 + 8));
              auVar117._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar97._8_8_;
              auVar117._0_8_ = (ulong)(bVar55 & 1) * auVar97._0_8_;
              auVar117._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar97._16_8_;
              auVar117._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar97._24_8_;
              auVar117._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar97._32_8_;
              auVar117._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar97._40_8_;
              auVar117._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar97._48_8_;
              auVar117._56_8_ = (uVar64 >> 7) * auVar97._56_8_;
              auVar100 = vsubpd_avx512f(auVar100,auVar117);
              auVar97 = vgatherqpd_avx512f(pcVar42->jz);
              auVar118._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar97._8_8_;
              auVar118._0_8_ = (ulong)(bVar55 & 1) * auVar97._0_8_;
              auVar118._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar97._16_8_;
              auVar118._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar97._24_8_;
              auVar118._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar97._32_8_;
              auVar118._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar97._40_8_;
              auVar118._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar97._48_8_;
              auVar118._56_8_ = (uVar64 >> 7) * auVar97._56_8_;
              auVar100 = vmulpd_avx512f(auVar90,auVar100);
              auVar100 = vfmadd231pd_avx512f(auVar100,in_ZMM17,auVar98);
              auVar100 = vfmadd213pd_avx512f(auVar100,auVar83,auVar118);
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar41->nx + (long)pcVar46));
              auVar119._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar98._8_8_;
              auVar119._0_8_ = (ulong)(bVar55 & 1) * auVar98._0_8_;
              auVar119._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar98._16_8_;
              auVar119._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar98._24_8_;
              auVar119._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar98._32_8_;
              auVar119._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar98._40_8_;
              auVar119._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar98._48_8_;
              auVar119._56_8_ = (uVar64 >> 7) * auVar98._56_8_;
              auVar98 = vgatherqpd_avx512f(*(undefined8 *)
                                            ((long)&pfVar41->nx + (long)ppcVar44[uVar66 + 1]));
              auVar120._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar98._8_8_;
              auVar120._0_8_ = (ulong)(bVar55 & 1) * auVar98._0_8_;
              auVar120._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar98._16_8_;
              auVar120._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar98._24_8_;
              auVar120._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar98._32_8_;
              auVar120._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar98._40_8_;
              auVar120._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar98._48_8_;
              auVar120._56_8_ = (uVar64 >> 7) * auVar98._56_8_;
              auVar98 = vsubpd_avx512f(auVar120,auVar82);
              auVar82 = vsubpd_avx512f(auVar82,auVar119);
              auVar98 = vaddpd_avx512f(auVar119,auVar98);
              auVar97 = vgatherqpd_avx512f(*(undefined8 *)((long)&pfVar41->nx + (long)pcVar45));
              auVar121._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar97._8_8_;
              auVar121._0_8_ = (ulong)(bVar55 & 1) * auVar97._0_8_;
              auVar121._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar97._16_8_;
              auVar121._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar97._24_8_;
              auVar121._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar97._32_8_;
              auVar121._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar97._40_8_;
              auVar121._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar97._48_8_;
              auVar121._56_8_ = (uVar64 >> 7) * auVar97._56_8_;
              auVar98 = vsubpd_avx512f(auVar98,auVar121);
              auVar98 = vmulpd_avx512f(auVar86,auVar98);
              auVar82 = vfmadd231pd_avx512f(auVar98,in_ZMM16,auVar82);
              auVar98 = vgatherqpd_avx512f(pcVar45->bz);
              auVar122._8_8_ = (ulong)((byte)(uVar64 >> 1) & 1) * auVar98._8_8_;
              auVar122._0_8_ = (ulong)(bVar55 & 1) * auVar98._0_8_;
              auVar122._16_8_ = (ulong)((byte)(uVar64 >> 2) & 1) * auVar98._16_8_;
              auVar122._24_8_ = (ulong)((byte)(uVar64 >> 3) & 1) * auVar98._24_8_;
              auVar122._32_8_ = (ulong)((byte)(uVar64 >> 4) & 1) * auVar98._32_8_;
              auVar122._40_8_ = (ulong)((byte)(uVar64 >> 5) & 1) * auVar98._40_8_;
              auVar122._48_8_ = (ulong)((byte)(uVar64 >> 6) & 1) * auVar98._48_8_;
              auVar122._56_8_ = (uVar64 >> 7) * auVar98._56_8_;
              auVar82 = vfmadd213pd_avx512f(auVar82,in_ZMM18,auVar100);
              auVar82 = vfnmadd213pd_avx512f(auVar122,auVar93,auVar82);
              vscatterqpd_avx512f(ZEXT864(0x10) + auVar99,uVar64,auVar82);
              auVar82 = vmovdqu64_avx512f(auVar123);
              auVar100 = auVar109;
              auVar98 = in_ZMM31;
              auVar97 = auVar115;
              auVar99 = auVar108;
            } while (((ulong)(uVar39 - 2) + 5 & 0x1fffffff8) != uVar62);
          }
          uVar66 = uVar66 + 1;
        } while (uVar66 != uVar63);
      }
      uVar67 = uVar67 + 1;
    } while (uVar67 != uVar61);
  }
  if (4 < iVar38) {
    auVar123 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
    auVar80 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar81 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar82 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar83 = vpbroadcastq_avx512f();
    uVar67 = 2;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = this->by;
    auVar84 = vbroadcastsd_avx512f(auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar85 = vbroadcastsd_avx512f(auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = this->az;
    auVar86 = vbroadcastsd_avx512f(auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = this->bz;
    auVar87 = vbroadcastsd_avx512f(auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (this->super_maxwell_solver).dx;
    auVar88 = vbroadcastsd_avx512f(auVar25);
    auVar57._8_8_ = 0x8000000000000000;
    auVar57._0_8_ = 0x8000000000000000;
    auVar72 = vxorpd_avx512vl(auVar129,auVar57);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = this->ay;
    auVar89 = vbroadcastsd_avx512f(auVar26);
    auVar90 = vbroadcastsd_avx512f(auVar72);
    do {
      if (4 < (int)uVar39) {
        auVar92 = vmovdqa64_avx512f(auVar123);
        pcVar43 = (pfVar40->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl[1][uVar67];
        ppcVar44 = (((this->super_maxwell_solver).cb)->p)._M_t.
                   super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                   super__Head_base<0UL,_cellb_***,_false>._M_head_impl[1];
        pcVar65 = ppcVar44[uVar67];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pcVar65[2].by;
        auVar91 = vbroadcastsd_avx512f(auVar27);
        uVar66 = 0;
        do {
          auVar93 = vpbroadcastq_avx512f();
          vpmullq_avx512dq(auVar92,auVar81);
          auVar72 = vxorpd_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar69 = vxorpd_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          auVar73 = vxorpd_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar70 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          uVar64 = uVar66 + 8;
          auVar92 = vpaddq_avx512f(auVar92,auVar82);
          auVar93 = vporq_avx512f(auVar93,auVar80);
          uVar62 = vpcmpuq_avx512f(auVar93,auVar83,2);
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar43->ey + uVar66));
          bVar55 = (byte)uVar62;
          auVar74._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar74._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          auVar95._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          auVar95._0_16_ = auVar74;
          auVar95._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          auVar95._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          auVar95._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          auVar95._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          auVar95._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65[1].bx + uVar66));
          auVar96._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar96._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
          auVar96._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          auVar96._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          auVar96._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          auVar96._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          auVar96._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          auVar96._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar44[uVar67 - 1][1].bx + uVar66));
          auVar75._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar73._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar75._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar73._8_8_;
          auVar101._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          auVar101._0_16_ = auVar75;
          auVar101._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          auVar101._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          auVar101._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          auVar101._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          auVar101._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar44[uVar67 + 1][1].bx + uVar66));
          in_ZMM20._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar70._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          in_ZMM20._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar70._8_8_;
          in_ZMM20._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          in_ZMM20._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          in_ZMM20._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          in_ZMM20._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          in_ZMM20._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          in_ZMM20._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar93 = vsubpd_avx512f(auVar96,auVar101);
          auVar96 = vsubpd_avx512f(in_ZMM20,auVar96);
          auVar96 = vaddpd_avx512f(auVar101,auVar96);
          auVar72 = vxorpd_avx512vl(auVar75,auVar75);
          auVar101 = vgatherqpd_avx512f(*(undefined8 *)((long)&ppcVar44[uVar67 - 2][1].bx + uVar66))
          ;
          auVar76._0_8_ =
               (ulong)(bVar55 & 1) * auVar101._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar76._8_8_ = (ulong)bVar56 * auVar101._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          auVar102._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar101._16_8_;
          auVar102._0_16_ = auVar76;
          auVar102._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar101._24_8_;
          auVar102._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar101._32_8_;
          auVar102._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar101._40_8_;
          auVar102._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar101._48_8_;
          auVar102._56_8_ = (uVar62 >> 7) * auVar101._56_8_;
          auVar96 = vsubpd_avx512f(auVar96,auVar102);
          auVar72 = vxorpd_avx512vl(auVar76,auVar76);
          auVar96 = vmulpd_avx512f(auVar89,auVar96);
          auVar93 = vfmadd231pd_avx512f(auVar96,auVar84,auVar93);
          in_ZMM17 = vfmadd213pd_avx512f(auVar93,auVar85,auVar95);
          auVar69 = vxorpd_avx512vl(auVar74,auVar74);
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar65 + uVar66 + 0xfffffffffffffff8))
          ;
          auVar103._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar103._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
          auVar103._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          auVar103._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          auVar103._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          auVar103._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          auVar103._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          auVar103._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65[1].bz + uVar66));
          in_ZMM18._0_8_ =
               (ulong)(bVar55 & 1) * auVar93._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          in_ZMM18._8_8_ = (ulong)bVar56 * auVar93._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          in_ZMM18._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          in_ZMM18._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          in_ZMM18._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          in_ZMM18._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          in_ZMM18._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          in_ZMM18._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          auVar91 = vpermt2pd_avx512f(_DAT_00138cc0,auVar91);
          auVar93 = vsubpd_avx512f(auVar91,auVar103);
          auVar91 = vsubpd_avx512f(in_ZMM18,auVar91);
          auVar95 = vaddpd_avx512f(auVar103,auVar91);
          auVar72 = vxorpd_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar91 = vgatherqpd_avx512f(*(undefined8 *)((long)pcVar65 + uVar66 + 0xffffffffffffffe0))
          ;
          in_ZMM19._0_8_ =
               (ulong)(bVar55 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          in_ZMM19._8_8_ = (ulong)bVar56 * auVar91._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          in_ZMM19._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar91._16_8_;
          in_ZMM19._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar91._24_8_;
          in_ZMM19._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar91._32_8_;
          in_ZMM19._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar91._40_8_;
          in_ZMM19._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar91._48_8_;
          in_ZMM19._56_8_ = (uVar62 >> 7) * auVar91._56_8_;
          auVar91 = vsubpd_avx512f(auVar95,in_ZMM19);
          auVar91 = vmulpd_avx512f(auVar86,auVar91);
          auVar91 = vfmadd231pd_avx512f(auVar91,auVar87,auVar93);
          auVar93 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(((this->super_maxwell_solver).cj)->p)._M_t.
                                                super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                .super__Head_base<0UL,_cellj_***,_false>.
                                                _M_head_impl[1][uVar67]->jy + uVar66));
          auVar100._8_8_ = (ulong)((byte)(uVar62 >> 1) & 1) * auVar93._8_8_;
          auVar100._0_8_ = (ulong)(bVar55 & 1) * auVar93._0_8_;
          auVar100._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar93._16_8_;
          auVar100._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar93._24_8_;
          auVar100._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar93._32_8_;
          auVar100._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar93._40_8_;
          auVar100._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar93._48_8_;
          auVar100._56_8_ = (uVar62 >> 7) * auVar93._56_8_;
          in_ZMM16 = vfmadd213pd_avx512f(auVar91,auVar90,in_ZMM17);
          auVar91 = vfnmadd213pd_avx512f(auVar100,auVar88,in_ZMM16);
          vscatterqpd_avx512f(ZEXT864(pcVar43) + auVar83,uVar62,auVar91);
          uVar66 = uVar64;
          auVar91 = in_ZMM18;
        } while (((ulong)(uVar39 - 2) + 5 & 0x1fffffff8) != uVar64);
      }
      uVar67 = uVar67 + 1;
    } while (uVar67 != uVar63);
  }
  if (4 < iVar37) {
    auVar123 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
    auVar80 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar81 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar82 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar83 = vpbroadcastq_avx512f();
    uVar67 = 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = this->bx;
    auVar84 = vbroadcastsd_avx512f(auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = this->az;
    auVar85 = vbroadcastsd_avx512f(auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = this->bz;
    auVar86 = vbroadcastsd_avx512f(auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (this->super_maxwell_solver).dtdz;
    auVar87 = vbroadcastsd_avx512f(auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (this->super_maxwell_solver).dy;
    auVar88 = vbroadcastsd_avx512f(auVar32);
    pfVar41 = (this->super_maxwell_solver).cj;
    auVar58._8_8_ = 0x8000000000000000;
    auVar58._0_8_ = 0x8000000000000000;
    auVar72 = vxorpd_avx512vl(auVar130,auVar58);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = this->ax;
    auVar89 = vbroadcastsd_avx512f(auVar33);
    auVar90 = vbroadcastsd_avx512f(auVar72);
    do {
      if (4 < (int)uVar39) {
        pppcVar47 = (((this->super_maxwell_solver).cb)->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        uVar66 = 0;
        auVar92 = vmovdqa64_avx512f(auVar123);
        pcVar65 = pppcVar47[uVar67][1];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = pcVar65[2].bx;
        auVar91 = vbroadcastsd_avx512f(auVar34);
        pcVar43 = (pfVar40->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar67][1];
        auVar93 = vpbroadcastq_avx512f();
        do {
          auVar95 = vpbroadcastq_avx512f();
          auVar96 = vpmullq_avx512dq(auVar92,auVar81);
          auVar72 = vxorpd_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar69 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          auVar73 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          auVar70 = vxorpd_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          uVar66 = uVar66 + 8;
          auVar92 = vpaddq_avx512f(auVar92,auVar82);
          auVar95 = vporq_avx512f(auVar95,auVar80);
          uVar62 = vpcmpuq_avx512f(auVar95,auVar83,2);
          vpaddq_avx512f(auVar93,auVar96);
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)&pfVar41->nz);
          bVar55 = (byte)uVar62;
          auVar77._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar77._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          auVar99._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          auVar99._0_16_ = auVar77;
          auVar99._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          auVar99._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          auVar99._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          auVar99._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          auVar99._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar65->bz + (long)pcVar43));
          auVar94._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar94._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
          auVar94._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          auVar94._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          auVar94._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          auVar94._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          auVar94._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          auVar94._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pppcVar47[uVar67 - 1][1]->bz + (long)pcVar43));
          auVar78._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar73._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar78._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar73._8_8_;
          auVar124._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          auVar124._0_16_ = auVar78;
          auVar124._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          auVar124._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          auVar124._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          auVar124._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          auVar124._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&pppcVar47[uVar67 + 1][1]->bz + (long)pcVar43));
          in_ZMM22._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar70._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          in_ZMM22._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar70._8_8_;
          in_ZMM22._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          in_ZMM22._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          in_ZMM22._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          in_ZMM22._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          in_ZMM22._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          in_ZMM22._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar95 = vsubpd_avx512f(auVar94,auVar124);
          auVar96 = vsubpd_avx512f(in_ZMM22,auVar94);
          auVar96 = vaddpd_avx512f(auVar124,auVar96);
          auVar72 = vxorpd_avx512vl(auVar78,auVar78);
          auVar101 = vgatherqpd_avx512f(*(undefined8 *)
                                         ((long)&pppcVar47[uVar67 - 2][1]->bz + (long)pcVar43));
          auVar79._0_8_ =
               (ulong)(bVar55 & 1) * auVar101._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar79._8_8_ = (ulong)bVar56 * auVar101._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          auVar125._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar101._16_8_;
          auVar125._0_16_ = auVar79;
          auVar125._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar101._24_8_;
          auVar125._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar101._32_8_;
          auVar125._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar101._40_8_;
          auVar125._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar101._48_8_;
          auVar125._56_8_ = (uVar62 >> 7) * auVar101._56_8_;
          auVar96 = vsubpd_avx512f(auVar96,auVar125);
          auVar72 = vxorpd_avx512vl(auVar79,auVar79);
          auVar96 = vmulpd_avx512f(auVar89,auVar96);
          auVar95 = vfmadd231pd_avx512f(auVar96,auVar84,auVar95);
          in_ZMM19 = vfmadd213pd_avx512f(auVar95,auVar90,auVar99);
          auVar69 = vxorpd_avx512vl(auVar77,auVar77);
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar43->ex + (long)&pcVar65[-1].bx));
          auVar126._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar69._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar126._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar69._8_8_;
          auVar126._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          auVar126._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          auVar126._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          auVar126._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          auVar126._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          auVar126._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar43->ex + (long)&pcVar65[1].bx));
          in_ZMM20._0_8_ =
               (ulong)(bVar55 & 1) * auVar95._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          in_ZMM20._8_8_ = (ulong)bVar56 * auVar95._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          in_ZMM20._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          in_ZMM20._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          in_ZMM20._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          in_ZMM20._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          in_ZMM20._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          in_ZMM20._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          auVar91 = vpermt2pd_avx512f(_DAT_00138cc0,auVar91);
          auVar95 = vsubpd_avx512f(auVar91,auVar126);
          auVar91 = vsubpd_avx512f(in_ZMM20,auVar91);
          auVar96 = vaddpd_avx512f(auVar126,auVar91);
          auVar72 = vxorpd_avx512vl(auVar91._0_16_,auVar91._0_16_);
          auVar91 = vgatherqpd_avx512f(*(undefined8 *)((long)&pcVar43->ex + (long)&pcVar65[-2].bx));
          auVar127._0_8_ =
               (ulong)(bVar55 & 1) * auVar91._0_8_ | (ulong)!(bool)(bVar55 & 1) * auVar72._0_8_;
          bVar56 = (bool)((byte)(uVar62 >> 1) & 1);
          auVar127._8_8_ = (ulong)bVar56 * auVar91._8_8_ | (ulong)!bVar56 * auVar72._8_8_;
          auVar127._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar91._16_8_;
          auVar127._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar91._24_8_;
          auVar127._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar91._32_8_;
          auVar127._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar91._40_8_;
          auVar127._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar91._48_8_;
          auVar127._56_8_ = (uVar62 >> 7) * auVar91._56_8_;
          auVar91 = vsubpd_avx512f(auVar96,auVar127);
          auVar91 = vmulpd_avx512f(auVar85,auVar91);
          auVar91 = vfmadd231pd_avx512f(auVar91,auVar86,auVar95);
          auVar95 = vgatherqpd_avx512f(*(undefined8 *)
                                        ((long)&(pfVar41->p)._M_t.
                                                super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                                .super__Head_base<0UL,_cellj_***,_false>.
                                                _M_head_impl[uVar67][1]->jy + (long)pcVar43));
          auVar128._8_8_ = (ulong)((byte)(uVar62 >> 1) & 1) * auVar95._8_8_;
          auVar128._0_8_ = (ulong)(bVar55 & 1) * auVar95._0_8_;
          auVar128._16_8_ = (ulong)((byte)(uVar62 >> 2) & 1) * auVar95._16_8_;
          auVar128._24_8_ = (ulong)((byte)(uVar62 >> 3) & 1) * auVar95._24_8_;
          auVar128._32_8_ = (ulong)((byte)(uVar62 >> 4) & 1) * auVar95._32_8_;
          auVar128._40_8_ = (ulong)((byte)(uVar62 >> 5) & 1) * auVar95._40_8_;
          auVar128._48_8_ = (ulong)((byte)(uVar62 >> 6) & 1) * auVar95._48_8_;
          auVar128._56_8_ = (uVar62 >> 7) * auVar95._56_8_;
          in_ZMM18 = vfmadd213pd_avx512f(auVar91,auVar87,in_ZMM19);
          auVar91 = vfnmadd213pd_avx512f(auVar128,auVar88,in_ZMM18);
          vscatterqpd_avx512f(ZEXT864(8) + auVar83,uVar62,auVar91);
          auVar91 = in_ZMM20;
        } while (((ulong)(uVar39 - 2) + 5 & 0x1fffffff8) != uVar66);
      }
      uVar67 = uVar67 + 1;
    } while (uVar67 != uVar61);
    if (4 < iVar37) {
      uVar67 = 2;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = (this->super_maxwell_solver).dtdy;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = (this->super_maxwell_solver).dtdx;
      auVar132._8_8_ = 0;
      auVar132._0_8_ = this->bx;
      dVar2 = this->ax;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = this->by;
      dVar3 = this->ay;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = (this->super_maxwell_solver).dz;
      pfVar48 = (this->super_maxwell_solver).cb;
      pfVar41 = (this->super_maxwell_solver).cj;
      auVar59._8_8_ = 0x8000000000000000;
      auVar59._0_8_ = 0x8000000000000000;
      auVar72 = vxorpd_avx512vl(auVar136,auVar59);
      do {
        if (4 < iVar38) {
          pppcVar47 = (pfVar48->p)._M_t.
                      super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                      super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
          lVar68 = 0;
          ppcVar44 = pppcVar47[uVar67];
          ppcVar49 = pppcVar47[uVar67 - 2];
          ppcVar50 = pppcVar47[uVar67 - 1];
          ppcVar51 = pppcVar47[uVar67 + 1];
          pcVar65 = ppcVar44[2];
          ppcVar52 = (pfVar40->p)._M_t.
                     super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                     super__Head_base<0UL,_celle_***,_false>._M_head_impl[uVar67];
          ppcVar53 = (pfVar41->p)._M_t.
                     super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                     super__Head_base<0UL,_cellj_***,_false>._M_head_impl[uVar67];
          dVar4 = pcVar65[1].bx;
          do {
            pcVar45 = pcVar65 + 1;
            lVar54 = *(long *)((long)ppcVar52 + lVar68 + 0x10);
            dVar5 = *(double *)(*(long *)((long)ppcVar50 + lVar68 + 0x10) + 0x20);
            dVar6 = *(double *)(*(long *)((long)ppcVar44 + lVar68 + 8) + 0x18);
            pcVar65 = *(cellb **)((long)ppcVar44 + lVar68 + 0x18);
            plVar1 = (long *)((long)ppcVar44 + lVar68);
            dVar7 = pcVar65[1].bx;
            auVar139._8_8_ = 0;
            auVar139._0_8_ =
                 ((dVar5 + (*(double *)(*(long *)((long)ppcVar51 + lVar68 + 0x10) + 0x20) -
                           pcVar45->by)) -
                 *(double *)(*(long *)((long)ppcVar49 + lVar68 + 0x10) + 0x20)) * dVar2;
            auVar140._8_8_ = 0;
            auVar140._0_8_ = pcVar45->by - dVar5;
            auVar69 = vfmadd231sd_fma(auVar139,auVar132,auVar140);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)(lVar54 + 0x28);
            auVar69 = vfmadd213sd_fma(auVar69,auVar131,auVar35);
            lVar60 = lVar68 + 0x10;
            lVar68 = lVar68 + 8;
            auVar138._8_8_ = 0;
            auVar138._0_8_ = dVar3 * ((dVar6 + (dVar7 - dVar4)) - *(double *)(*plVar1 + 0x18));
            auVar141._8_8_ = 0;
            auVar141._0_8_ = dVar4 - dVar6;
            auVar73 = vfmadd231sd_fma(auVar138,auVar135,auVar141);
            auVar69 = vfmadd213sd_fma(auVar73,auVar72,auVar69);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = *(ulong *)(*(long *)((long)ppcVar53 + lVar60) + 0x28);
            auVar69 = vfnmadd231sd_fma(auVar69,auVar137,auVar36);
            *(long *)(lVar54 + 0x28) = auVar69._0_8_;
            dVar4 = dVar7;
          } while ((ulong)uVar63 * 8 + -0x10 != lVar68);
        }
        uVar67 = uVar67 + 1;
      } while (uVar67 != uVar61);
    }
  }
  return;
}

Assistant:

void five_point_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;

                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;

                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=1;
        for(int j=2;j<ny-2;j++) {
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ex = ce[i][j][k].ex   +   dtdy*( by*(cb[i][j][k].bz-cb[i][j-1][k].bz) + ay*(cb[i][j+1][k].bz-cb[i][j][k].bz+cb[i][j-1][k].bz-cb[i][j-2][k].bz) )  -   dtdz*( bz*(cb[i][j][k].by-cb[i][j][k-1].by) + az*(cb[i][j][k+1].by-cb[i][j][k].by+cb[i][j][k-1].by-cb[i][j][k-2].by) )  -   cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        {int j=1;
            for(int k=2;k<nz-2;k++) {
                ce[i][j][k].ey = ce[i][j][k].ey   -   dtdx*( bx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + ax*(cb[i+1][j][k].bz-cb[i][j][k].bz+cb[i-1][j][k].bz-cb[i-2][j][k].bz) )  +   dtdz*( bz*(cb[i][j][k].bx-cb[i][j][k-1].bx) + az*(cb[i][j][k+1].bx-cb[i][j][k].bx+cb[i][j][k-1].bx-cb[i][j][k-2].bx) )  -   cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=2;i<nx-2;i++) {
        for(int j=2;j<ny-2;j++) {
            {int k=1;
                ce[i][j][k].ez = ce[i][j][k].ez   +   dtdx*( bx*(cb[i][j][k].by-cb[i-1][j][k].by) + ax*(cb[i+1][j][k].by-cb[i][j][k].by+cb[i-1][j][k].by-cb[i-2][j][k].by) )  -   dtdy*( by*(cb[i][j][k].bx-cb[i][j-1][k].bx) + ay*(cb[i][j+1][k].bx-cb[i][j][k].bx+cb[i][j-1][k].bx-cb[i][j-2][k].bx) )  -   cj[i][j][k].jz*dz;
            }
        }
    }
}